

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_lifetime_analyzer.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnLifetimeAnalyzer::AddVerificationProjection
          (ColumnLifetimeAnalyzer *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *child)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  ColumnBinding binding;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *this_00;
  pointer pLVar3;
  BoundConstantExpression *pBVar4;
  const_reference __args;
  const_reference other;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_01;
  reference pvVar5;
  pointer pLVar6;
  iterator iVar7;
  ReplacementBinding *replacement_binding;
  long lVar8;
  ulong uVar9;
  pointer __k;
  size_type __n;
  ulong uVar10;
  element_type *__n_00;
  __hashtable *__h;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  expressions;
  vector<duckdb::ColumnBinding,_true> child_bindings;
  vector<duckdb::LogicalType,_true> child_types;
  ColumnBindingReplacer replacer;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_150;
  ColumnLifetimeAnalyzer *local_148;
  size_type local_140;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_138;
  ColumnLifetimeAnalyzer *local_120;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_118
  ;
  pointer local_110;
  pointer local_108;
  vector<duckdb::ColumnBinding,_true> local_100;
  Value local_e8;
  vector<duckdb::LogicalType,_true> local_a0;
  undefined1 local_88 [8];
  vector<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_> local_80;
  Val local_68 [2];
  LogicalType local_48;
  
  local_148 = this;
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(child);
  LogicalOperator::ResolveOperatorTypes(pLVar3);
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(child);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_a0,
             &(pLVar3->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(child);
  (*pLVar3->_vptr_LogicalOperator[2])(&local_100,pLVar3);
  local_110 = local_100.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_108 = local_100.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              _M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)local_100.
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_100.
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                _M_impl.super__Vector_impl_data._M_start;
  uVar10 = lVar8 >> 3;
  local_138.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118 = child;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::reserve((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_138,uVar10 | 1);
  local_140 = lVar8 >> 4;
  uVar9 = 0;
  do {
    LogicalType::LogicalType(&local_48,UTINYINT);
    Value::Value(&local_e8,&local_48);
    pBVar4 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value((Value *)local_88,&local_e8);
    BoundConstantExpression::BoundConstantExpression(pBVar4,(Value *)local_88);
    local_150._M_head_impl = pBVar4;
    Value::~Value((Value *)local_88);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_138,
               (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                *)&local_150);
    if (local_150._M_head_impl != (BoundConstantExpression *)0x0) {
      (*((local_150._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])()
      ;
    }
    local_150._M_head_impl = (BoundConstantExpression *)0x0;
    Value::~Value(&local_e8);
    LogicalType::~LogicalType(&local_48);
    uVar9 = uVar9 + 1;
  } while (uVar9 <= uVar10);
  local_120 = (ColumnLifetimeAnalyzer *)Binder::GenerateTableIndex(local_148->optimizer->binder);
  ColumnBindingReplacer::ColumnBindingReplacer((ColumnBindingReplacer *)local_88);
  if (local_110 != local_108) {
    local_140 = local_140 + (local_140 == 0);
    __n_00 = (element_type *)(uVar10 - 1);
    __n = 0;
    do {
      __args = vector<duckdb::ColumnBinding,_true>::operator[](&local_100,__n);
      other = vector<duckdb::LogicalType,_true>::operator[](&local_a0,__n);
      this_01._M_head_impl = (Expression *)operator_new(0x70);
      LogicalType::LogicalType(&local_e8.type_,other);
      binding.table_index = __args->table_index;
      binding.column_index = __args->column_index;
      BoundColumnRefExpression::BoundColumnRefExpression
                ((BoundColumnRefExpression *)this_01._M_head_impl,&local_e8.type_,binding,0);
      LogicalType::~LogicalType(&local_e8.type_);
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](&local_138,(size_type)__n_00);
      _Var1._M_head_impl =
           (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = this_01._M_head_impl;
      if (_Var1._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
      }
      local_e8.type_._0_8_ = local_120;
      local_e8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __n_00;
      ::std::vector<duckdb::ReplacementBinding,std::allocator<duckdb::ReplacementBinding>>::
      emplace_back<duckdb::ColumnBinding_const&,duckdb::ColumnBinding>
                ((vector<duckdb::ReplacementBinding,std::allocator<duckdb::ReplacementBinding>> *)
                 &local_80,__args,(ColumnBinding *)&local_e8.type_);
      __n = __n + 1;
      __n_00 = (element_type *)
               ((long)&__n_00[-1].extension_info.
                       super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                       .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl + 6);
    } while (local_140 != __n);
  }
  pBVar4 = (BoundConstantExpression *)operator_new(0x70);
  local_e8.type_._0_8_ =
       local_138.
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e8.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_138.
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e8.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_138.
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_138.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalProjection::LogicalProjection
            ((LogicalProjection *)pBVar4,(idx_t)local_120,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&local_e8);
  local_150._M_head_impl = pBVar4;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_e8);
  this_00 = local_118;
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(local_118);
  if (pLVar3->has_estimated_cardinality == true) {
    pLVar6 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
             ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                           *)&local_150);
    pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(this_00);
    LogicalOperator::SetEstimatedCardinality
              (&pLVar6->super_LogicalOperator,pLVar3->estimated_cardinality);
  }
  pLVar6 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
           ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                         *)&local_150);
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
            ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
              *)&(pLVar6->super_LogicalOperator).children,this_00);
  local_68[0]._0_8_ = local_150._M_head_impl;
  local_150._M_head_impl = (BoundConstantExpression *)0x0;
  _Var2._M_head_impl =
       (this_00->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (this_00->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (LogicalOperator *)local_68[0]._0_8_;
  if (_Var2._M_head_impl != (LogicalOperator *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_LogicalOperator + 8))();
    local_68[0]._0_8_ =
         (this_00->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  }
  ColumnBindingReplacer::VisitOperator((ColumnBindingReplacer *)local_88,local_148->root);
  if (local_80.
      super__Vector_base<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_80.
      super__Vector_base<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_148 = (ColumnLifetimeAnalyzer *)&local_148->column_references;
    __k = local_80.
          super__Vector_base<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar7 = ::std::
              _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find((_Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)local_148,&__k->old_binding);
      if (iVar7.super__Node_iterator_base<duckdb::ColumnBinding,_true>._M_cur != (__node_type *)0x0)
      {
        local_e8.type_._0_8_ = local_148;
        ::std::
        _Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<duckdb::ColumnBinding_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::ColumnBinding,true>>>>
                  ((_Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_148,(string *)&__k->new_binding,&local_e8);
      }
      __k = __k + 1;
    } while (__k != local_80.
                    super__Vector_base<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_150._M_head_impl != (BoundConstantExpression *)0x0) {
    (*((local_150._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
  }
  local_88 = (undefined1  [8])&PTR__ColumnBindingReplacer_02451270;
  ::std::vector<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_>::~vector
            (&local_80);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_138);
  if (local_100.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_a0);
  return;
}

Assistant:

void ColumnLifetimeAnalyzer::AddVerificationProjection(unique_ptr<LogicalOperator> &child) {
	child->ResolveOperatorTypes();
	const auto child_types = child->types;
	const auto child_bindings = child->GetColumnBindings();
	const auto column_count = child_bindings.size();

	// If our child has columns [i, j], we will generate a projection like so [NULL, j, NULL, i, NULL]
	const auto projection_column_count = column_count * 2 + 1;
	vector<unique_ptr<Expression>> expressions;
	expressions.reserve(projection_column_count);

	// First fill with all NULLs
	for (idx_t col_idx = 0; col_idx < projection_column_count; col_idx++) {
		expressions.emplace_back(make_uniq<BoundConstantExpression>(Value(LogicalType::UTINYINT)));
	}

	// Now place the "real" columns in their respective positions, while keeping track of which column becomes which
	const auto table_index = optimizer.binder.GenerateTableIndex();
	ColumnBindingReplacer replacer;
	for (idx_t col_idx = 0; col_idx < column_count; col_idx++) {
		const auto &old_binding = child_bindings[col_idx];
		const auto new_col_idx = projection_column_count - 2 - col_idx * 2;
		expressions[new_col_idx] = make_uniq<BoundColumnRefExpression>(child_types[col_idx], old_binding);
		replacer.replacement_bindings.emplace_back(old_binding, ColumnBinding(table_index, new_col_idx));
	}

	// Create a projection and swap the operators accordingly
	auto projection = make_uniq<LogicalProjection>(table_index, std::move(expressions));
	if (child->has_estimated_cardinality) {
		projection->SetEstimatedCardinality(child->estimated_cardinality);
	}
	projection->children.emplace_back(std::move(child));
	child = std::move(projection);

	// Replace references to the old binding (higher up in the plan) with references to the new binding
	replacer.stop_operator = child.get();
	replacer.VisitOperator(root);

	// Add new bindings to column_references, else they are considered "unused"
	for (const auto &replacement_binding : replacer.replacement_bindings) {
		if (column_references.find(replacement_binding.old_binding) != column_references.end()) {
			column_references.insert(replacement_binding.new_binding);
		}
	}
}